

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.hpp
# Opt level: O2

void __thiscall
helics::TimeCoordinator::processConfigUpdateMessage(TimeCoordinator *this,ActionMessage *cmd)

{
  action_t aVar1;
  
  aVar1 = cmd->messageAction;
  if (aVar1 == cmd_fed_configure_flag) {
    setOptionFlag(this,cmd->messageID,SUB41((cmd->flags & 0x20) >> 5,0));
    return;
  }
  if (aVar1 != cmd_fed_configure_int) {
    if (aVar1 == cmd_fed_configure_time) {
      setProperty(this,cmd->messageID,(Time)(cmd->actionTime).internalTimeCode);
      return;
    }
    return;
  }
  setProperty(this,cmd->messageID,(uint)cmd->counter);
  return;
}

Assistant:

action_message_def::action_t action() const noexcept { return messageAction; }